

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

int __thiscall deqp::egl::Image::ImageFormatCase::init(ImageFormatCase *this,EVP_PKEY_CTX *ctx)

{
  NativeDisplay *pNVar1;
  pointer pAVar2;
  int iVar3;
  int extraout_EAX;
  Library *egl;
  NativeWindowFactory *pNVar4;
  EGLDisplay pvVar5;
  EGLConfig pvVar6;
  undefined4 extraout_var;
  EGLSurface pvVar7;
  GLES2ImageApi *this_00;
  long lVar8;
  char *extensions [1];
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pNVar4 = eglu::selectNativeWindowFactory
                     (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  pvVar5 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_display = pvVar5;
  pvVar6 = getConfig(this);
  this->m_config = pvVar6;
  pvVar5 = this->m_display;
  pNVar1 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
           super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
           ptr;
  eglu::parseWindowVisibility
            (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  extensions[0] = (char *)0x1e0000001e0;
  iVar3 = (*(pNVar4->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar4,pNVar1,pvVar5,pvVar6);
  this->m_window = (NativeWindow *)CONCAT44(extraout_var,iVar3);
  pvVar7 = eglu::createWindowSurface
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(NativeWindow *)CONCAT44(extraout_var,iVar3),this->m_display,
                      this->m_config,(EGLAttrib *)0x0);
  this->m_surface = pvVar7;
  extensions[0] = "GL_OES_EGL_image";
  EglTestContext::initGLFunctions
            ((this->super_TestCase).m_eglTestCtx,&this->m_gl,(ApiType)0x2,1,extensions);
  for (lVar8 = 0;
      pAVar2 = (this->m_spec).contexts.
               super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar8 < (int)((ulong)((long)(this->m_spec).contexts.
                                  super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) >> 2);
      lVar8 = lVar8 + 1) {
    extensions[0] = (char *)0x0;
    if (pAVar2[lVar8] == API_GLES2) {
      this_00 = (GLES2ImageApi *)operator_new(0x50);
      GLES2ImageApi::GLES2ImageApi
                (this_00,egl,&this->m_gl,(int)lVar8,(this->super_CallLogWrapper).m_log,
                 this->m_display,this->m_surface,this->m_config);
      extensions[0] = (char *)this_00;
    }
    std::vector<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>::
    push_back(&this->m_apiContexts,(value_type *)extensions);
  }
  checkExtensions(this);
  return extraout_EAX;
}

Assistant:

void ImageFormatCase::init (void)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

	try
	{
		m_display	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
		m_config	= getConfig();
		m_window	= windowFactory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_display, m_config, DE_NULL, eglu::WindowParams(480, 480, eglu::parseWindowVisibility(m_testCtx.getCommandLine())));
		m_surface	= eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *m_window, m_display, m_config, DE_NULL);

		{
			const char* extensions[] = { "GL_OES_EGL_image" };
			m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2, 0), DE_LENGTH_OF_ARRAY(extensions), &extensions[0]);
		}

		for (int contextNdx = 0; contextNdx < (int)m_spec.contexts.size(); contextNdx++)
		{
			ImageApi* api = DE_NULL;
			switch (m_spec.contexts[contextNdx])
			{
				case TestSpec::API_GLES2:
				{
					api = new GLES2ImageApi(egl, m_gl, contextNdx, getLog(), m_display, m_surface, m_config);
					break;
				}

				default:
					DE_ASSERT(false);
					break;
			}
			m_apiContexts.push_back(api);
		}
		checkExtensions();
	}
	catch (...)
	{
		deinit();
		throw;
	}
}